

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O1

Hashtable * __thiscall
icu_63::CanonicalIterator::extract
          (CanonicalIterator *this,Hashtable *fillinResult,UChar32 comp,UChar *segment,
          int32_t segLen,int32_t segmentPos,UErrorCode *status)

{
  UChar *srcChars;
  int8_t iVar1;
  undefined4 uVar2;
  undefined8 *value;
  undefined4 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint srcChar;
  UChar *size;
  uint uVar7;
  int iVar8;
  bool bVar9;
  UnicodeString temp;
  UnicodeString trial;
  UnicodeString decompString;
  char16_t *local_140;
  ConstChar16Ptr local_118;
  UChar *local_110;
  UChar *local_100;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::UnicodeString(&local_f0,comp);
    uVar2 = local_f0.fUnion.fFields.fLength;
    if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
      uVar2 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,&local_f0,&local_70,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        if ((local_70.fUnion.fStackFields.fLengthAndFlags & 0x10U) == 0) {
          local_140 = local_70.fUnion.fFields.fArray;
          if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            local_140 = local_70.fUnion.fStackFields.fBuffer;
          }
        }
        else {
          local_140 = (char16_t *)0x0;
        }
        uVar3 = local_70.fUnion.fFields.fLength;
        if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
          uVar3 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        uVar7 = (uint)(ushort)*local_140;
        iVar8 = 1;
        if (((uVar3 != 1) && ((uVar7 & 0xfc00) == 0xd800)) &&
           (((ushort)local_140[1] & 0xfc00) == 0xdc00)) {
          uVar7 = (uint)(ushort)*local_140 * 0x400 + (uint)(ushort)local_140[1] + 0xfca02400;
          iVar8 = 2;
        }
        iVar5 = segmentPos;
        if (segLen - segmentPos != 0 && segmentPos <= segLen) {
          do {
            iVar6 = iVar5 + 1;
            srcChar = (uint)(ushort)segment[iVar5];
            if ((iVar6 != segLen && (srcChar & 0xfc00) == 0xd800) &&
               (lVar4 = (long)iVar6, ((ushort)segment[lVar4] & 0xfc00) == 0xdc00)) {
              iVar6 = iVar5 + 2;
              srcChar = (uint)(ushort)segment[iVar5] * 0x400 + (uint)(ushort)segment[lVar4] +
                        0xfca02400;
            }
            if (srcChar == uVar7) {
              if (iVar8 == uVar3) {
                srcChars = segment + iVar6;
                size = srcChars;
                UnicodeString::doAppend(&local_f0,srcChars,0,segLen - iVar6);
                uVar3 = local_f0.fUnion.fFields.fLength;
                if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
                  uVar3 = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                local_100 = srcChars;
                if (uVar2 == uVar3) {
                  local_b0.super_Replaceable.super_UObject._vptr_UObject =
                       (UObject)&PTR__UnicodeString_003b5258;
                  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
                  value = (undefined8 *)UMemory::operator_new((UMemory *)0x40,(size_t)size);
                  if (value == (undefined8 *)0x0) {
                    value = (undefined8 *)0x0;
                  }
                  else {
                    *value = &PTR__UnicodeString_003b5258;
                    *(undefined2 *)(value + 1) = 2;
                  }
                  Hashtable::put(fillinResult,&local_b0,value,status);
                }
                else {
                  local_b0.super_Replaceable.super_UObject._vptr_UObject =
                       (UObject)&PTR__UnicodeString_003b5258;
                  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
                  (*(this->nfd->super_UObject)._vptr_UObject[3])
                            (this->nfd,&local_f0,&local_b0,status);
                  bVar9 = true;
                  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                    local_118.p_ = segment + segmentPos;
                    iVar1 = UnicodeString::compare(&local_b0,&local_118,segLen - segmentPos);
                    bVar9 = iVar1 != '\0';
                    local_110 = local_118.p_;
                  }
                  if (bVar9) {
                    fillinResult = (Hashtable *)0x0;
                  }
                  else {
                    if ((local_f0.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
                      if ((local_f0.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
                        local_f0.fUnion.fFields.fArray = local_f0.fUnion.fStackFields.fBuffer;
                      }
                    }
                    else {
                      local_f0.fUnion.fFields.fArray = (char16_t *)0x0;
                    }
                    if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
                      local_f0.fUnion.fFields.fLength =
                           (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    fillinResult = getEquivalents2(this,fillinResult,
                                                   (char16_t *)
                                                   ((long)local_f0.fUnion.fFields.fArray +
                                                   (long)(int)uVar2 * 2),
                                                   local_f0.fUnion.fFields.fLength - uVar2,status);
                  }
                }
                UnicodeString::~UnicodeString(&local_b0);
                goto LAB_0027edf9;
              }
              iVar5 = iVar8 + 1;
              uVar7 = (uint)(ushort)local_140[iVar8];
              if ((((uVar7 & 0xfc00) == 0xd800) && (iVar5 != uVar3)) &&
                 (((ushort)local_140[iVar5] & 0xfc00) == 0xdc00)) {
                uVar7 = uVar7 * 0x400 + (uint)(ushort)local_140[iVar5] + 0xfca02400;
                iVar5 = iVar8 + 2;
              }
            }
            else {
              UnicodeString::append(&local_f0,srcChar);
              iVar5 = iVar8;
            }
            iVar8 = iVar5;
            iVar5 = iVar6;
          } while (iVar6 < segLen);
        }
      }
      else {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    fillinResult = (Hashtable *)0x0;
LAB_0027edf9:
    UnicodeString::~UnicodeString(&local_70);
    UnicodeString::~UnicodeString(&local_f0);
  }
  else {
    fillinResult = (Hashtable *)0x0;
  }
  return fillinResult;
}

Assistant:

Hashtable *CanonicalIterator::extract(Hashtable *fillinResult, UChar32 comp, const UChar *segment, int32_t segLen, int32_t segmentPos, UErrorCode &status) {
//Hashtable *CanonicalIterator::extract(UChar32 comp, const UnicodeString &segment, int32_t segLen, int32_t segmentPos, UErrorCode &status) {
    //if (PROGRESS) printf(" extract: %s, ", UToS(Tr(UnicodeString(comp))));
    //if (PROGRESS) printf("%s, %i\n", UToS(Tr(segment)), segmentPos);

    if (U_FAILURE(status)) {
        return NULL;
    }

    UnicodeString temp(comp);
    int32_t inputLen=temp.length();
    UnicodeString decompString;
    nfd.normalize(temp, decompString, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    if (decompString.isBogus()) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    const UChar *decomp=decompString.getBuffer();
    int32_t decompLen=decompString.length();

    // See if it matches the start of segment (at segmentPos)
    UBool ok = FALSE;
    UChar32 cp;
    int32_t decompPos = 0;
    UChar32 decompCp;
    U16_NEXT(decomp, decompPos, decompLen, decompCp);

    int32_t i = segmentPos;
    while(i < segLen) {
        U16_NEXT(segment, i, segLen, cp);

        if (cp == decompCp) { // if equal, eat another cp from decomp

            //if (PROGRESS) printf("  matches: %s\n", UToS(Tr(UnicodeString(cp))));

            if (decompPos == decompLen) { // done, have all decomp characters!
                temp.append(segment+i, segLen-i);
                ok = TRUE;
                break;
            }
            U16_NEXT(decomp, decompPos, decompLen, decompCp);
        } else {
            //if (PROGRESS) printf("  buffer: %s\n", UToS(Tr(UnicodeString(cp))));

            // brute force approach
            temp.append(cp);

            /* TODO: optimize
            // since we know that the classes are monotonically increasing, after zero
            // e.g. 0 5 7 9 0 3
            // we can do an optimization
            // there are only a few cases that work: zero, less, same, greater
            // if both classes are the same, we fail
            // if the decomp class < the segment class, we fail

            segClass = getClass(cp);
            if (decompClass <= segClass) return null;
            */
        }
    }
    if (!ok)
        return NULL; // we failed, characters left over

    //if (PROGRESS) printf("Matches\n");

    if (inputLen == temp.length()) {
        fillinResult->put(UnicodeString(), new UnicodeString(), status);
        return fillinResult; // succeed, but no remainder
    }

    // brute force approach
    // check to make sure result is canonically equivalent
    UnicodeString trial;
    nfd.normalize(temp, trial, status);
    if(U_FAILURE(status) || trial.compare(segment+segmentPos, segLen - segmentPos) != 0) {
        return NULL;
    }

    return getEquivalents2(fillinResult, temp.getBuffer()+inputLen, temp.length()-inputLen, status);
}